

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Build(cmake *this,string *dir,string *target,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,bool clean)

{
  cmState *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  cmGlobalGenerator *this_00;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *toplevel;
  allocator local_10a;
  allocator local_109;
  string output;
  string cachePath;
  string local_c0;
  string projName;
  string cacheFile;
  string local_50;
  
  toplevel = nativeOptions;
  std::__cxx11::string::string((string *)&cachePath,"",(allocator *)&cacheFile);
  SetHomeDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::string((string *)&cachePath,"",(allocator *)&cacheFile);
  SetHomeOutputDirectory(this,&cachePath);
  std::__cxx11::string::~string((string *)&cachePath);
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar5 = std::operator<<(poVar5,(string *)dir);
    std::operator<<(poVar5," is not a directory\n");
    return 1;
  }
  std::__cxx11::string::string((string *)&cachePath,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&cachePath);
  std::__cxx11::string::string((string *)&cacheFile,(string *)&cachePath);
  std::__cxx11::string::append((char *)&cacheFile);
  bVar2 = cmsys::SystemTools::FileExists(cacheFile._M_dataplus._M_p);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&output,(string *)&cachePath);
    std::__cxx11::string::append((char *)&output);
    bVar2 = cmsys::SystemTools::FileExists(output._M_dataplus._M_p);
    if (bVar2) {
      cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                (&projName,(cmSystemTools *)0x4926fc,cachePath._M_dataplus._M_p,"/",(char *)toplevel
                );
      if (projName._M_string_length != 0) {
        cmsys::SystemTools::GetFilenamePath(&local_c0,&projName);
        std::__cxx11::string::operator=((string *)&cachePath,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::__cxx11::string::~string((string *)&projName);
    }
    std::__cxx11::string::~string((string *)&output);
  }
  bVar2 = LoadCache(this,&cachePath);
  if (bVar2) {
    pcVar1 = this->State;
    std::__cxx11::string::string((string *)&output,"CMAKE_GENERATOR",(allocator *)&projName);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&output);
    std::__cxx11::string::~string((string *)&output);
    if (pcVar4 == (char *)0x0) {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
    }
    else {
      std::__cxx11::string::string((string *)&output,pcVar4,(allocator *)&projName);
      this_00 = CreateGlobalGenerator(this,&output);
      std::__cxx11::string::~string((string *)&output);
      if (this_00 != (cmGlobalGenerator *)0x0) {
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        projName._M_dataplus._M_p = (pointer)&projName.field_2;
        projName._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        projName.field_2._M_local_buf[0] = '\0';
        pcVar1 = this->State;
        std::__cxx11::string::string
                  ((string *)&local_c0,"CMAKE_PROJECT_NAME",(allocator *)&local_50);
        pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        if (pcVar4 == (char *)0x0) {
          std::operator<<((ostream *)&std::cerr,
                          "Error: could not find CMAKE_PROJECT_NAME in Cache\n");
          iVar3 = 1;
        }
        else {
          std::__cxx11::string::assign((char *)&projName);
          pcVar1 = this->State;
          std::__cxx11::string::string
                    ((string *)&local_c0,"CMAKE_VERBOSE_MAKEFILE",(allocator *)&local_50);
          pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          if (pcVar4 == (char *)0x0) {
            bVar2 = false;
          }
          else {
            bVar2 = cmSystemTools::IsOn(pcVar4);
          }
          std::__cxx11::string::string((string *)&local_c0,"",&local_109);
          std::__cxx11::string::string((string *)&local_50,"",&local_10a);
          iVar3 = cmGlobalGenerator::Build
                            (this_00,&local_c0,dir,&projName,target,&output,&local_50,config,clean,
                             false,bVar2,0.0,OUTPUT_PASSTHROUGH,nativeOptions);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__cxx11::string::~string((string *)&projName);
        std::__cxx11::string::~string((string *)&output);
        (*this_00->_vptr_cmGlobalGenerator[1])();
        goto LAB_002c3215;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error: could create CMAKE_GENERATOR \"");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::operator<<(poVar5,"\"\n");
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
  }
  iVar3 = 1;
LAB_002c3215:
  std::__cxx11::string::~string((string *)&cacheFile);
  std::__cxx11::string::~string((string *)&cachePath);
  return iVar3;
}

Assistant:

int cmake::Build(const std::string& dir,
                 const std::string& target,
                 const std::string& config,
                 const std::vector<std::string>& nativeOptions,
                 bool clean)
{

  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");
  if(!cmSystemTools::FileIsDirectory(dir))
    {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
    }
  std::string cachePath = dir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cachePath;
  cacheFile += "/CMakeCache.txt";
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    // search in parent directories for cache
    std::string cmakeFiles = cachePath;
    cmakeFiles += "/CMakeFiles";
    if(cmSystemTools::FileExists(cmakeFiles.c_str()))
      {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories(
          "CMakeCache.txt", cachePath.c_str(), "/");
      if(!cachePathFound.empty())
        {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
        }
      }
    }

  if(!this->LoadCache(cachePath))
    {
    std::cerr << "Error: could not load cache\n";
    return 1;
    }
  const char* cachedGenerator =
      this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if(!cachedGenerator)
    {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
    }
  cmsys::auto_ptr<cmGlobalGenerator> gen(
    this->CreateGlobalGenerator(cachedGenerator));
  if(!gen.get())
    {
    std::cerr << "Error: could create CMAKE_GENERATOR \""
              << cachedGenerator << "\"\n";
    return 1;
    }
  std::string output;
  std::string projName;
  const char* cachedProjectName =
      this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if(!cachedProjectName)
    {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
    }
  projName = cachedProjectName;
  bool verbose = false;
  const char* cachedVerbose =
      this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE");
  if(cachedVerbose)
    {
    verbose = cmSystemTools::IsOn(cachedVerbose);
    }
  return gen->Build("", dir,
                    projName, target,
                    output,
                    "",
                    config, clean, false, verbose, 0,
                    cmSystemTools::OUTPUT_PASSTHROUGH,
                    nativeOptions);
}